

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t decoder_destroy(aom_codec_alg_priv_t *ctx)

{
  long *plVar1;
  AVxWorkerInterface *pAVar2;
  AV1CdefWorkerData **in_RDI;
  size_t i;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  AV1CdefWorkerData *local_28;
  AV1_COMMON *in_stack_ffffffffffffffe0;
  AV1Decoder *pbi_00;
  
  if (in_RDI[0xd3e] != (AV1CdefWorkerData *)0x0) {
    pbi_00 = (AV1Decoder *)in_RDI[0xd3e];
    pAVar2 = aom_get_worker_interface();
    (*pAVar2->end)((AVxWorker *)pbi_00);
    plVar1 = (long *)(pbi_00->dcb).xd.plane[0].dst.buf;
    if ((plVar1 != (long *)0x0) && (*plVar1 != 0)) {
      in_stack_ffffffffffffffe0 = (AV1_COMMON *)*plVar1;
      aom_free(in_stack_ffffffffffffffe0);
      in_stack_ffffffffffffffe0[1].quant_params.gqmatrix[0xf][1][0xc] = (qm_val_t *)0x0;
      av1_remove_common((AV1_COMMON *)0x18e9b5);
      av1_free_cdef_buffers((AV1_COMMON *)i,in_RDI,(AV1CdefSync *)pbi_00);
      av1_free_cdef_sync((AV1CdefSync *)0x18e9ef);
      av1_free_restoration_buffers(in_stack_ffffffffffffffe0);
      av1_decoder_remove(pbi_00);
    }
    aom_free(in_stack_ffffffffffffffe0);
  }
  if (in_RDI[0xd62] != (AV1CdefWorkerData *)0x0) {
    for (local_28 = (AV1CdefWorkerData *)0x0; local_28 < in_RDI[0xd60];
        local_28 = (AV1CdefWorkerData *)((long)&local_28->cm + 1)) {
      (*(code *)in_RDI[0xd62]->linebuf[1])
                (in_RDI[0xd62]->srcbuf,in_RDI + (long)local_28 * 3 + 0xd54);
    }
    av1_free_ref_frame_buffers((BufferPool *)in_stack_ffffffffffffffe0);
    av1_free_internal_frame_buffers((InternalFrameBufferList *)in_stack_ffffffffffffffe0);
    pthread_mutex_destroy((pthread_mutex_t *)in_RDI[0xd62]);
  }
  aom_free(in_stack_ffffffffffffffe0);
  aom_free(in_stack_ffffffffffffffe0);
  aom_img_free((aom_image_t *)0x18eaef);
  aom_free(in_stack_ffffffffffffffe0);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t decoder_destroy(aom_codec_alg_priv_t *ctx) {
  if (ctx->frame_worker != NULL) {
    AVxWorker *const worker = ctx->frame_worker;
    aom_get_worker_interface()->end(worker);
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    if (frame_worker_data != NULL && frame_worker_data->pbi != NULL) {
      AV1Decoder *const pbi = frame_worker_data->pbi;
      aom_free(pbi->common.tpl_mvs);
      pbi->common.tpl_mvs = NULL;
      av1_remove_common(&pbi->common);
      av1_free_cdef_buffers(&pbi->common, &pbi->cdef_worker, &pbi->cdef_sync);
      av1_free_cdef_sync(&pbi->cdef_sync);
      av1_free_restoration_buffers(&pbi->common);
      av1_decoder_remove(pbi);
    }
    aom_free(frame_worker_data);
  }

  if (ctx->buffer_pool) {
    for (size_t i = 0; i < ctx->num_grain_image_frame_buffers; i++) {
      ctx->buffer_pool->release_fb_cb(ctx->buffer_pool->cb_priv,
                                      &ctx->grain_image_frame_buffers[i]);
    }
    av1_free_ref_frame_buffers(ctx->buffer_pool);
    av1_free_internal_frame_buffers(&ctx->buffer_pool->int_frame_buffers);
#if CONFIG_MULTITHREAD
    pthread_mutex_destroy(&ctx->buffer_pool->pool_mutex);
#endif
  }

  aom_free(ctx->frame_worker);
  aom_free(ctx->buffer_pool);
  assert(!ctx->img.self_allocd);
  aom_img_free(&ctx->img);
  aom_free(ctx);
  return AOM_CODEC_OK;
}